

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O2

StatementProperties * __thiscall
duckdb::PreparedStatement::GetStatementProperties
          (StatementProperties *__return_storage_ptr__,PreparedStatement *this)

{
  PreparedStatementData *pPVar1;
  
  pPVar1 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&this->data);
  StatementProperties::StatementProperties(__return_storage_ptr__,&pPVar1->properties);
  return __return_storage_ptr__;
}

Assistant:

StatementProperties PreparedStatement::GetStatementProperties() {
	D_ASSERT(data);
	return data->properties;
}